

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_317c8b::ConvolveTestBase::IsIndexInBorder(ConvolveTestBase *this,int i)

{
  int iVar1;
  ParamType *pPVar2;
  bool bVar3;
  int iVar4;
  ConvolveTestBase *this_00;
  
  iVar4 = (int)this;
  this_00 = this;
  iVar1 = BorderTop(this);
  bVar3 = true;
  if (iVar1 << 9 <= iVar4) {
    iVar1 = BorderTop(this_00);
    pPVar2 = testing::
             WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
             ::GetParam();
    if (iVar4 < (iVar1 + (pPVar2->
                         super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                         ).
                         super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                         .super__Head_base<1UL,_int,_false>._M_head_impl) * 0x200) {
      iVar1 = BorderLeft(this_00);
      iVar4 = (int)((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 | (ulong)this & 0xffffffff) % 0x200)
      ;
      if (iVar1 <= iVar4) {
        iVar1 = BorderLeft(this_00);
        pPVar2 = testing::
                 WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                 ::GetParam();
        bVar3 = iVar1 + *(int *)&(pPVar2->
                                 super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                 ).
                                 super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                 .field_0xc <= iVar4;
      }
    }
  }
  return bVar3;
}

Assistant:

bool IsIndexInBorder(int i) {
    return (i < BorderTop() * kOuterBlockSize ||
            i >= (BorderTop() + Height()) * kOuterBlockSize ||
            i % kOuterBlockSize < BorderLeft() ||
            i % kOuterBlockSize >= (BorderLeft() + Width()));
  }